

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sobel.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_t sVar1;
  ostream *poVar2;
  string sStack_108;
  _Vector_base<int,_std::allocator<int>_> local_e8;
  arguments_t args;
  Mat image;
  long local_78;
  _InputArray local_28;
  
  arguments_t::arguments_t(&args,argc,argv);
  sVar1 = arguments_t::parametersSize(&args);
  if (sVar1 < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," input output");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    arguments_t::operator[][abi_cxx11_(&sStack_108,&args,0);
    cv::imread((string *)&image,(int)&sStack_108);
    std::__cxx11::string::~string((string *)&sStack_108);
    if (local_78 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Cannot load ");
      arguments_t::operator[][abi_cxx11_(&sStack_108,&args,0);
      poVar2 = std::operator<<(poVar2,(string *)&sStack_108);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      gaussianFilter(&image,1,1.0);
      sobelFilter(&image);
      binaryFilter(&image,0.5);
      arguments_t::operator[][abi_cxx11_(&sStack_108,&args,1);
      local_28.sz.width = 0;
      local_28.sz.height = 0;
      local_28.flags = 0x1010000;
      local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_28.obj = &image;
      cv::imwrite((string *)&sStack_108,&local_28,(vector *)&local_e8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_e8);
    }
    std::__cxx11::string::~string((string *)&sStack_108);
    cv::Mat::~Mat(&image);
  }
  arguments_t::~arguments_t(&args);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    arguments_t args(argc, argv);

	if (args.parametersSize() < 2) {
		std::cout << "usage: " << argv[0] << " input output" << std::endl;
		return 0;
	}

    auto image = cv::imread(args[0], cv::IMREAD_GRAYSCALE);
	if (!image.data) {
		std::cout << "Cannot load " << args[0] << std::endl;
		return 0;
	}

	gaussianFilter(image, 1, 1);
    sobelFilter(image);
    binaryFilter(image, 0.5);

    cv::imwrite(args[1], image);

    return 0;
}